

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_slot.cpp
# Opt level: O2

void __thiscall CsSignal::SlotBase::~SlotBase(SlotBase *this)

{
  rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
  *prVar1;
  iterator iter;
  rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
  *this_00;
  __pointer_type pnVar2;
  write_handle senderListHandle;
  read_handle receiverListHandle;
  write_handle local_68;
  read_handle local_48;
  
  this->_vptr_SlotBase = (_func_int **)&PTR__SlotBase_0010ad68;
  local_48.m_accessed = false;
  local_48.m_ptr = &(this->m_possibleSenders).m_obj;
  prVar1 = libguarded::
           rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
           ::read_handle::operator*(&local_48);
  pnVar2 = (prVar1->m_head)._M_b._M_p;
LAB_00107a59:
  if (pnVar2 == (__pointer_type)0x0) {
    libguarded::
    rcu_guarded<libguarded::rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>_>
    ::read_handle::~read_handle(&local_48);
    libguarded::
    rcu_list<const_CsSignal::SignalBase_*,_std::mutex,_std::allocator<const_CsSignal::SignalBase_*>_>
    ::~rcu_list(&(this->m_possibleSenders).m_obj);
    return;
  }
  local_68.m_ptr = &(pnVar2->data->m_connectList).m_obj;
  local_68.m_accessed = false;
  iter.m_current =
       (node *)libguarded::
               rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
               ::write_handle::operator->(&local_68);
  do {
    iter.m_current = ((iter.m_current)->next)._M_b._M_p;
    while( true ) {
      libguarded::
      rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
      ::write_handle::operator->(&local_68);
      if (iter.m_current == (node *)0x0) {
        libguarded::
        rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
        ::write_handle::~write_handle(&local_68);
        pnVar2 = (pnVar2->next)._M_b._M_p;
        goto LAB_00107a59;
      }
      if (((iter.m_current)->data).receiver != this) break;
      this_00 = libguarded::
                rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
                ::write_handle::operator->(&local_68);
      iter = libguarded::
             rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>
             ::erase(this_00,iter.m_current);
    }
  } while( true );
}

Assistant:

CsSignal::SlotBase::~SlotBase()
{
   try {
      // clean up possible sender connections
      auto receiverListHandle = m_possibleSenders.lock_read();

      for (auto &sender : *receiverListHandle) {
         auto senderListHandle = sender->m_connectList.lock_write();

         auto iter = senderListHandle->begin();

         while (iter != senderListHandle->end())   {

            if (iter->receiver == this) {
               iter = senderListHandle->erase(iter);
            } else {
               ++iter;
            }
         }
      }

   } catch (...) {
     // least of the worst options
     std::terminate();
   }
}